

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
          (TessellationShaderTessellationgl_TessCoord *this,Context *context,
          ExtParameters *extParams,_tessellation_test_type test_type)

{
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,getTypeName::names[test_type],&local_49);
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,(char *)local_48[0],
             "Verifies that u, v, w components of gl_TessCoord are within range for a variety of input/outer tessellation level combinations for all primitive modes. Verifies each component is within valid  range. Also checks that w is always equal to 0 for isolines mode."
            );
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTessellationgl_TessCoord_02159e60;
  this->m_test_type = test_type;
  this->m_bo_id = 0;
  this->m_broken_ts_id = 0;
  this->m_fs_id = 0;
  this->m_vs_id = 0;
  *(undefined8 *)&this->m_vao_id = 0;
  *(undefined8 *)
   ((long)&(this->m_tests).
           super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_tests).
           super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_tests).
           super__Vector_base<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)((long)&this->m_utils_ptr + 4) = 0;
  return;
}

Assistant:

TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord(
	Context& context, const ExtParameters& extParams, _tessellation_test_type test_type)
	: TestCaseBase(context, extParams, getTypeName(test_type).c_str(),
				   "Verifies that u, v, w components of gl_TessCoord are within "
				   "range for a variety of input/outer tessellation level combinations "
				   "for all primitive modes. Verifies each component is within valid "
				   " range. Also checks that w is always equal to 0 for isolines mode.")
	, m_test_type(test_type)
	, m_bo_id(0)
	, m_broken_ts_id(0)
	, m_fs_id(0)
	, m_vs_id(0)
	, m_vao_id(0)
	, m_utils_ptr(0)
{
	/* Left blank on purpose */
}